

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O2

ostream * Hex::operator<<(ostream *os,Hexdumper<unsigned_long> *hd)

{
  long lVar1;
  
  Hexdumper<unsigned_long>::dump(hd,os);
  lVar1 = *(long *)os;
  *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 0x10) = 0;
  lVar1 = *(long *)(lVar1 + -0x18);
  std::ios::fill();
  os[lVar1 + 0xe0] = (ostream)0x0;
  lVar1 = *(long *)os;
  *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 8) = 0;
  *(undefined4 *)(os + *(long *)(lVar1 + -0x18) + 0x18) = 0;
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream&os, const Hexdumper<T>& hd)
    {
        hd.dump(os);

        // reset stream settings
        os.width(0);
        os.fill(0);
        os.precision(0);
        os.flags(std::ios_base::fmtflags(0));
        return os;
    }